

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes31TestPackage.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::TestCaseWrapper::iterate(TestCaseWrapper *this,TestCase *testCase)

{
  IterateResult IVar1;
  Context *pCVar2;
  RenderContext *pRVar3;
  ResourceError *e;
  exception *e_1;
  IterateResult result;
  TestContext *testCtx;
  TestCase *testCase_local;
  TestCaseWrapper *this_local;
  
  pCVar2 = TestPackage::getContext(this->m_testPackage);
  Context::getTestContext(pCVar2);
  IVar1 = (*(testCase->super_TestNode)._vptr_TestNode[4])();
  pCVar2 = TestPackage::getContext(this->m_testPackage);
  pRVar3 = Context::getRenderContext(pCVar2);
  (*pRVar3->_vptr_RenderContext[5])();
  return IVar1;
}

Assistant:

tcu::TestNode::IterateResult TestCaseWrapper::iterate (tcu::TestCase* testCase)
{
	tcu::TestContext&					testCtx	= m_testPackage.getContext()->getTestContext();
	const tcu::TestCase::IterateResult	result	= testCase->iterate();

	// Call implementation specific post-iterate routine (usually handles native events and swaps buffers)
	try
	{
		m_testPackage.getContext()->getRenderContext().postIterate();
		return result;
	}
	catch (const tcu::ResourceError& e)
	{
		testCtx.getLog() << e;
		testCtx.setTestResult(QP_TEST_RESULT_RESOURCE_ERROR, "Resource error in context post-iteration routine");
		testCtx.setTerminateAfter(true);
		return tcu::TestNode::STOP;
	}
	catch (const std::exception& e)
	{
		testCtx.getLog() << e;
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Error in context post-iteration routine");
		return tcu::TestNode::STOP;
	}
}